

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void registerSymbol(Symbol *sym)

{
  uint32_t uVar1;
  
  *objectSymbolsTail = sym;
  objectSymbolsTail = &sym->next;
  out_RegisterNode(sym->src);
  if (nbSymbols != 0xffffffff) {
    uVar1 = nbSymbols + 1;
    sym->ID = nbSymbols;
    nbSymbols = uVar1;
    return;
  }
  fatalerror("Registered too many symbols (%u); try splitting up your files\n",0xffffffff);
}

Assistant:

static void registerSymbol(struct Symbol *sym)
{
	*objectSymbolsTail = sym;
	objectSymbolsTail = &sym->next;
	out_RegisterNode(sym->src);
	if (nbSymbols == (uint32_t)-1)
		fatalerror("Registered too many symbols (%" PRIu32
			   "); try splitting up your files\n", (uint32_t)-1);
	sym->ID = nbSymbols++;
}